

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tagger.cpp
# Opt level: O3

bool __thiscall MeCab::anon_unknown_0::LatticeImpl::is_available(LatticeImpl *this)

{
  if ((this->sentence_ != (char *)0x0) &&
     ((this->begin_nodes_).super__Vector_base<mecab_node_t_*,_std::allocator<mecab_node_t_*>_>.
      _M_impl.super__Vector_impl_data._M_start !=
      (this->begin_nodes_).super__Vector_base<mecab_node_t_*,_std::allocator<mecab_node_t_*>_>.
      _M_impl.super__Vector_impl_data._M_finish)) {
    return (this->end_nodes_).super__Vector_base<mecab_node_t_*,_std::allocator<mecab_node_t_*>_>.
           _M_impl.super__Vector_impl_data._M_start !=
           (this->end_nodes_).super__Vector_base<mecab_node_t_*,_std::allocator<mecab_node_t_*>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  }
  return false;
}

Assistant:

bool is_available() const {
    return (sentence_ &&
            !begin_nodes_.empty() &&
            !end_nodes_.empty());
  }